

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::WriteLengthDelimited
          (internal *this,uint32_t num,StringPiece val,string *s)

{
  bool bVar1;
  char *pcVar2;
  undefined4 in_register_00000034;
  char cVar3;
  ulong uVar4;
  
  pcVar2 = val.ptr_;
  uVar4 = (ulong)((int)this * 8 + 2);
  cVar3 = (char)val.length_;
  if (0x7f < (uint)((int)this << 3)) {
    do {
      std::__cxx11::string::push_back(cVar3);
      bVar1 = 0x3fff < uVar4;
      uVar4 = uVar4 >> 7;
    } while (bVar1);
  }
  std::__cxx11::string::push_back(cVar3);
  if ((char *)0x7f < pcVar2) {
    do {
      std::__cxx11::string::push_back(cVar3);
      bVar1 = (char *)0x3fff < pcVar2;
      pcVar2 = (char *)((ulong)pcVar2 >> 7);
    } while (bVar1);
  }
  std::__cxx11::string::push_back(cVar3);
  std::__cxx11::string::append((char *)val.length_,CONCAT44(in_register_00000034,num));
  return;
}

Assistant:

void WriteLengthDelimited(uint32_t num, StringPiece val, std::string* s) {
  WriteVarint((num << 3) + 2, s);
  WriteVarint(val.size(), s);
  s->append(val.data(), val.size());
}